

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Multi_Browser.H
# Opt level: O0

void __thiscall Fl_Multi_Browser::~Fl_Multi_Browser(Fl_Multi_Browser *this)

{
  Fl_Multi_Browser *this_local;
  
  ~Fl_Multi_Browser(this);
  operator_delete(this,0x2a0);
  return;
}

Assistant:

class FL_EXPORT Fl_Multi_Browser : public Fl_Browser {
public:
  /**
      Creates a new Fl_Multi_Browser widget using the given
    position, size, and label string. The default boxtype is FL_DOWN_BOX.
    The constructor specializes Fl_Browser() by setting the type to FL_MULTI_BROWSER.
    The destructor destroys the widget and frees all memory that has been allocated.
  */
    Fl_Multi_Browser(int X,int Y,int W,int H,const char *L=0);
}